

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformation_gizmo.cpp
# Opt level: O2

tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> * __thiscall
polyscope::TransformationGizmo::lineTest
          (tuple<float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *__return_storage_ptr__,
          TransformationGizmo *this,vec3 raySource,vec3 rayDir,vec3 center,vec3 tangent,float length
          )

{
  undefined8 uVar1;
  undefined1 auVar2 [16];
  _Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_> *p_Var3;
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  ulong extraout_XMM0_Qb;
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined8 in_XMM4_Qb;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 aVar16;
  undefined8 in_XMM6_Qb;
  vec<3,_float,_(glm::qualifier)0> vVar17;
  undefined1 local_c8 [8];
  undefined8 uStack_c0;
  vec<3,_float,_(glm::qualifier)0> local_b8;
  vec<3,_float,_(glm::qualifier)0> local_a8;
  undefined1 local_98 [16];
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  vec<3,_float,_(glm::qualifier)0> local_70;
  vec<3,_float,_(glm::qualifier)0> local_60;
  vec<3,_float,_(glm::qualifier)0> local_50;
  vec<3,_float,_(glm::qualifier)0> local_40;
  
  local_b8.field_2 = tangent.field_2;
  aVar16 = center.field_2;
  local_a8.field_2 = rayDir.field_2;
  auVar14._8_56_ = rayDir._8_56_;
  auVar14._0_8_ = rayDir._0_8_;
  aVar13 = raySource.field_2;
  auVar9._8_56_ = raySource._8_56_;
  auVar9._0_8_ = raySource._0_8_;
  uStack_c0 = in_XMM4_Qb;
  local_c8 = (undefined1  [8])center._0_8_;
  _local_88 = auVar9._0_16_;
  local_a8._0_8_ = vmovlps_avx(auVar14._0_16_);
  auVar4._8_8_ = in_XMM6_Qb;
  auVar4._0_8_ = tangent._0_8_;
  local_b8._0_8_ = vmovlps_avx(auVar4);
  vVar17 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_a8,&local_b8);
  local_60.field_2 = vVar17.field_2;
  auVar10._0_8_ = vVar17._0_8_;
  auVar10._8_56_ = auVar9._8_56_;
  local_60._0_8_ = vmovlps_avx(auVar10._0_16_);
  fVar5 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_60);
  auVar9._8_56_ = ZEXT856(extraout_XMM0_Qb);
  if (1e-06 <= fVar5) {
    vVar17 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_b8,&local_60);
    local_40.field_2 = vVar17.field_2;
    auVar11._0_8_ = vVar17._0_8_;
    auVar11._8_56_ = auVar9._8_56_;
    local_40._0_8_ = vmovlpd_avx(auVar11._0_16_);
    vVar17 = glm::detail::compute_cross<float,_(glm::qualifier)0,_false>::call(&local_a8,&local_60);
    local_50.field_2 = vVar17.field_2;
    auVar12._0_8_ = vVar17._0_8_;
    auVar12._8_56_ = auVar9._8_56_;
    local_50._0_8_ = vmovlpd_avx(auVar12._0_16_);
    auVar4 = vsubps_avx(_local_c8,_local_88);
    local_70.field_2.z = aVar16.z - aVar13.z;
    local_70._0_8_ = vmovlps_avx(auVar4);
    fVar5 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                      (&local_70,&local_40);
    fVar6 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                      (&local_a8,&local_40);
    auVar4 = vsubps_avx(_local_88,_local_c8);
    local_70.field_2.z = aVar13.z - aVar16.z;
    local_70._0_8_ = vmovlps_avx(auVar4);
    local_98._0_4_ =
         glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                   (&local_70,&local_50);
    fVar7 = glm::detail::compute_dot<glm::vec<3,_float,_(glm::qualifier)0>,_float,_false>::call
                      (&local_b8,&local_50);
    fVar7 = (float)local_98._0_4_ / fVar7;
    auVar2._8_4_ = 0x80000000;
    auVar2._0_8_ = 0x8000000080000000;
    auVar2._12_4_ = 0x80000000;
    auVar4 = vxorps_avx512vl(ZEXT416((uint)length),auVar2);
    if (auVar4._0_4_ <= fVar7) {
      fVar5 = fVar5 / fVar6;
      local_98 = ZEXT416((uint)fVar5);
      if ((0.0 <= fVar5) && (fVar7 <= length)) {
        fVar6 = fVar7 * local_b8.field_2.z + aVar16.z;
        local_c8._0_4_ = center.field_0;
        local_c8._4_4_ = center.field_1;
        uStack_c0._0_4_ = (float)in_XMM4_Qb;
        uStack_c0._4_4_ = (float)((ulong)in_XMM4_Qb >> 0x20);
        auVar15._0_4_ = fVar7 * local_b8.field_0.x + (float)local_c8._0_4_;
        auVar15._4_4_ = fVar7 * local_b8.field_1.y + (float)local_c8._4_4_;
        auVar15._8_4_ = fVar7 * 0.0 + (float)uStack_c0;
        auVar15._12_4_ = fVar7 * 0.0 + uStack_c0._4_4_;
        local_70.field_2.z = (fVar5 * local_a8.field_2.z + aVar13.z) - fVar6;
        auVar8._0_4_ = fVar5 * local_a8.field_0.x + (float)local_88._0_4_;
        auVar8._4_4_ = fVar5 * local_a8.field_1.y + (float)local_88._4_4_;
        auVar8._8_4_ = fVar5 * 0.0 + fStack_80;
        auVar8._12_4_ = fVar5 * 0.0 + fStack_7c;
        auVar4 = vsubps_avx(auVar8,auVar15);
        local_70._0_8_ = vmovlps_avx(auVar4);
        fVar5 = glm::detail::compute_length<3,_float,_(glm::qualifier)0,_false>::call(&local_70);
        uVar1 = vmovlpd_avx(auVar15);
        p_Var3 = &(__return_storage_ptr__->
                  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
                  super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
        (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
        super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
             (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(int)uVar1;
        (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
        super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)
             (int)((ulong)uVar1 >> 0x20);
        (__return_storage_ptr__->
        super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
        super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
        super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
        super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2.z =
             fVar6;
        (__return_storage_ptr__->
        super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
        super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
        super__Head_base<1UL,_float,_false>._M_head_impl = fVar5;
        (__return_storage_ptr__->
        super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
        super__Head_base<0UL,_float,_false>._M_head_impl = (float)local_98._0_4_;
        return __return_storage_ptr__;
      }
    }
  }
  p_Var3 = &(__return_storage_ptr__->
            super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
            super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)0x0;
  (p_Var3->super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_1 =
       (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)0x0;
  *(undefined8 *)
   &(__return_storage_ptr__->
    super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
    super__Tuple_impl<1UL,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>.
    super__Tuple_impl<2UL,_glm::vec<3,_float,_(glm::qualifier)0>_>.
    super__Head_base<2UL,_glm::vec<3,_float,_(glm::qualifier)0>,_false>._M_head_impl.field_2 =
       0x7f80000000000000;
  (__return_storage_ptr__->
  super__Tuple_impl<0UL,_float,_float,_glm::vec<3,_float,_(glm::qualifier)0>_>).
  super__Head_base<0UL,_float,_false>._M_head_impl = -1.0;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<float, float, glm::vec3> TransformationGizmo::lineTest(glm::vec3 raySource, glm::vec3 rayDir,
                                                                  glm::vec3 center, glm::vec3 tangent, float length) {

  // used for explicit constructors below to make old compilers (gcc-5) happy
  typedef std::tuple<float, float, glm::vec3> ret_t;

  glm::vec3 nBetween = glm::cross(rayDir, tangent);
  if (glm::length(nBetween) < 1e-6)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // parallel

  glm::vec3 nTan = glm::cross(tangent, nBetween);
  glm::vec3 nRay = glm::cross(rayDir, nBetween);

  float tRay = glm::dot(center - raySource, nTan) / glm::dot(rayDir, nTan);
  float tLine = glm::dot(raySource - center, nRay) / glm::dot(tangent, nRay);

  if (tLine < -length || tLine > length || tRay < 0)
    return ret_t{-1, std::numeric_limits<float>::infinity(), glm::vec3{0., 0., 0.}}; // out of bounds or beind

  glm::vec3 pRay = raySource + tRay * rayDir;
  glm::vec3 pLine = center + tLine * tangent;

  return ret_t{tRay, glm::length(pRay - pLine), pLine};
}